

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O1

void __thiscall wasm::AvoidReinterprets::optimize(AvoidReinterprets *this,Function *func)

{
  map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
  *this_00;
  byte bVar1;
  Load *pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  Index IVar6;
  Memory *pMVar7;
  Type TVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  Type in_R8;
  pair<std::_Rb_tree_iterator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::_Rb_tree_iterator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
  pVar11;
  undefined1 auStack_168 [8];
  FinalOptimizer finalOptimizer;
  set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> unoptimizables;
  
  unoptimizables._M_t._M_impl._0_4_ = 0;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var9 = (this->infos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = (_Rb_tree_node_base *)&unoptimizables;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&unoptimizables;
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)func;
  while (unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var10,
        (_Rb_tree_header *)p_Var9 != &(this->infos)._M_t._M_impl.super__Rb_tree_header) {
    p_Var10 = p_Var9 + 1;
    if (((*(char *)&p_Var9[1]._M_parent == '\x01') &&
        (pLVar2 = *(Load **)p_Var10,
        (pLVar2->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id != 1))
       && (bVar1 = pLVar2->bytes,
          uVar5 = wasm::Type::getByteSize
                            (&(pLVar2->super_SpecificExpression<(wasm::Expression::Id)12>).
                              super_Expression.type), uVar5 == bVar1)) {
      pMVar7 = Module::getMemory((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                 .
                                 super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                 .currModule,(Name)((*(Load **)p_Var10)->memory).super_IString.str);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (pMVar7->addressType).id;
      IVar6 = Builder::addVar((Builder *)
                              unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (Function *)0x0,(Name)(auVar3 << 0x40),in_R8);
      *(Index *)((long)&p_Var9[1]._M_parent + 4) = IVar6;
      TVar8 = wasm::Type::reinterpret((Type *)(*(long *)(p_Var9 + 1) + 8));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = TVar8.id;
      IVar6 = Builder::addVar((Builder *)
                              unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
      *(Index *)&p_Var9[1]._M_left = IVar6;
    }
    else {
      std::
      _Rb_tree<wasm::Load*,wasm::Load*,std::_Identity<wasm::Load*>,std::less<wasm::Load*>,std::allocator<wasm::Load*>>
      ::_M_insert_unique<wasm::Load*const&>
                ((_Rb_tree<wasm::Load*,wasm::Load*,std::_Identity<wasm::Load*>,std::less<wasm::Load*>,std::allocator<wasm::Load*>>
                  *)&finalOptimizer.passOptions,(Load **)p_Var10);
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    p_Var10 = unoptimizables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  this_00 = &this->infos;
  if (p_Var10 != (_Rb_tree_node_base *)&unoptimizables) {
    do {
      auStack_168 = *(undefined1 (*) [8])(p_Var10 + 1);
      pVar11 = std::
               _Rb_tree<wasm::Load_*,_std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>,_std::_Select1st<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)auStack_168);
      std::
      _Rb_tree<wasm::Load_*,_std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>,_std::_Select1st<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node
                    );
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != (_Rb_tree_node_base *)&unoptimizables);
  }
  finalOptimizer.infos =
       (map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
        *)this->localGraph;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currFunction =
       (Function *)
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
       ).super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>.
       super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>.
       currModule;
  finalOptimizer.module =
       (Module *)
       &((this->
         super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
         ).super_Pass.runner)->options;
  auStack_168 = (undefined1  [8])0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.replacep = (Expression **)0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
  super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currModule = (Module *)this_00;
  finalOptimizer.localGraph =
       (LocalGraph *)
       finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
       super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.currFunction;
  Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::walk
            ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)auStack_168,
             (Expression **)(unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60)
            );
  if (finalOptimizer.super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
      super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(finalOptimizer.
                    super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
                    super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)finalOptimizer.
                          super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
                          super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finalOptimizer.
                          super_PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.
                          super_Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  std::
  _Rb_tree<wasm::Load_*,_wasm::Load_*,_std::_Identity<wasm::Load_*>,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>
  ::~_Rb_tree((_Rb_tree<wasm::Load_*,_wasm::Load_*,_std::_Identity<wasm::Load_*>,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>
               *)&finalOptimizer.passOptions);
  return;
}

Assistant:

void optimize(Function* func) {
    std::set<Load*> unoptimizables;
    for (auto& [load, info] : infos) {
      if (info.reinterpreted && canReplaceWithReinterpret(load)) {
        // We should use another load here, to avoid reinterprets.
        auto mem = getModule()->getMemory(load->memory);
        info.ptrLocal = Builder::addVar(func, mem->addressType);
        info.reinterpretedLocal =
          Builder::addVar(func, load->type.reinterpret());
      } else {
        unoptimizables.insert(load);
      }
    }
    for (auto* load : unoptimizables) {
      infos.erase(load);
    }
    // We now know which we can optimize, and how.
    struct FinalOptimizer : public PostWalker<FinalOptimizer> {
      std::map<Load*, Info>& infos;
      LocalGraph* localGraph;
      Module* module;
      const PassOptions& passOptions;

      FinalOptimizer(std::map<Load*, Info>& infos,
                     LocalGraph* localGraph,
                     Module* module,
                     const PassOptions& passOptions)
        : infos(infos), localGraph(localGraph), module(module),
          passOptions(passOptions) {}

      void visitUnary(Unary* curr) {
        if (isReinterpret(curr)) {
          auto* value = curr->value;
          if (auto* load = value->dynCast<Load>()) {
            // A reinterpret of a load - flip it right here if we can.
            if (canReplaceWithReinterpret(load)) {
              replaceCurrent(makeReinterpretedLoad(load, load->ptr));
            }
          } else if (auto* get = value->dynCast<LocalGet>()) {
            if (auto* load =
                  getSingleLoad(localGraph, get, passOptions, *module)) {
              auto iter = infos.find(load);
              if (iter != infos.end()) {
                auto& info = iter->second;
                // A reinterpret of a get of a load - use the new local.
                Builder builder(*module);
                replaceCurrent(builder.makeLocalGet(info.reinterpretedLocal,
                                                    load->type.reinterpret()));
              }
            }
          }
        }
      }

      void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto addressType = mem->addressType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, addressType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, addressType))),
             curr}));
        }
      }

      Load* makeReinterpretedLoad(Load* load, Expression* ptr) {
        Builder builder(*module);
        return builder.makeLoad(load->bytes,
                                false,
                                load->offset,
                                load->align,
                                ptr,
                                load->type.reinterpret(),
                                load->memory);
      }
    } finalOptimizer(infos, localGraph, getModule(), getPassOptions());

    finalOptimizer.setModule(getModule());
    finalOptimizer.walk(func->body);
  }